

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O3

void __thiscall Assimp::LWOImporter::ResolveTags(LWOImporter *this)

{
  pointer pSVar1;
  char *__s1;
  _Alloc_hider __s2;
  size_type sVar2;
  int iVar3;
  TagList *pTVar4;
  pointer pbVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  value_type_conflict1 local_34;
  
  local_34 = 0xffffffff;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (this->mMapping,
             (long)(this->mTags->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->mTags->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5,&local_34);
  pTVar4 = this->mTags;
  pbVar5 = (pTVar4->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((pTVar4->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pbVar5) {
    uVar6 = 0;
    do {
      pSVar1 = (this->mSurfaces->
               super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>).
               _M_impl.super__Vector_impl_data._M_start;
      lVar7 = (long)(this->mSurfaces->
                    super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>)
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1;
      if (lVar7 != 0) {
        uVar8 = (lVar7 >> 3) * -0x7063e7063e7063e7;
        sVar2 = pbVar5[uVar6]._M_string_length;
        uVar9 = 0;
        do {
          if ((int)pSVar1[uVar9].mName._M_string_length == (int)sVar2) {
            __s1 = pbVar5[uVar6]._M_dataplus._M_p;
            if (__s1 == (char *)0x0) {
              __assert_fail("__null != s1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/include/assimp/StringComparison.h"
                            ,0x8a,"int Assimp::ASSIMP_stricmp(const char *, const char *)");
            }
            __s2._M_p = pSVar1[uVar9].mName._M_dataplus._M_p;
            if (__s2._M_p == (char *)0x0) {
              __assert_fail("__null != s2",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/include/assimp/StringComparison.h"
                            ,0x8b,"int Assimp::ASSIMP_stricmp(const char *, const char *)");
            }
            iVar3 = strcasecmp(__s1,__s2._M_p);
            if (iVar3 == 0) {
              (this->mMapping->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
              _M_impl.super__Vector_impl_data._M_start[uVar6] = (uint)uVar9;
              pTVar4 = this->mTags;
              pbVar5 = (pTVar4->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              break;
            }
          }
          uVar9 = (ulong)((uint)uVar9 + 1);
        } while (uVar9 <= uVar8 && uVar8 - uVar9 != 0);
      }
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (uVar6 < (ulong)((long)(pTVar4->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5 >> 5))
    ;
  }
  return;
}

Assistant:

void LWOImporter::ResolveTags()
{
    // --- this function is used for both LWO2 and LWOB
    mMapping->resize(mTags->size(), UINT_MAX);
    for (unsigned int a = 0; a  < mTags->size();++a)    {

        const std::string& c = (*mTags)[a];
        for (unsigned int i = 0; i < mSurfaces->size();++i) {

            const std::string& d = (*mSurfaces)[i].mName;
            if (!ASSIMP_stricmp(c,d))   {

                (*mMapping)[a] = i;
                break;
            }
        }
    }
}